

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O2

s32 __thiscall
irr::gui::CGUIFont::getKerningWidth(CGUIFont *this,wchar_t *thisLetter,wchar_t *previousLetter)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = this->GlobalKerningWidth;
  if (thisLetter != (wchar_t *)0x0) {
    uVar1 = getAreaFromCharacter(this,*thisLetter);
    iVar2 = iVar2 + (this->Areas).m_data.
                    super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar1].overhang;
    if (previousLetter != (wchar_t *)0x0) {
      uVar1 = getAreaFromCharacter(this,*previousLetter);
      iVar2 = iVar2 + (this->Areas).m_data.
                      super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar1].underhang;
    }
  }
  return iVar2;
}

Assistant:

s32 CGUIFont::getKerningWidth(const wchar_t *thisLetter, const wchar_t *previousLetter) const
{
	s32 ret = GlobalKerningWidth;

	if (thisLetter) {
		ret += Areas[getAreaFromCharacter(*thisLetter)].overhang;

		if (previousLetter) {
			ret += Areas[getAreaFromCharacter(*previousLetter)].underhang;
		}
	}

	return ret;
}